

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O1

SharedPtr<FontEffect> __thiscall
Rml::FontEffectOutlineInstancer::InstanceFontEffect
          (FontEffectOutlineInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Colourb _colour;
  bool bVar1;
  Property *pPVar2;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int _width;
  SharedPtr<FontEffect> SVar4;
  SharedPtr<Rml::FontEffectOutline> font_effect;
  undefined1 local_41;
  FontEffectOutline *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  local_40._0_1_ = '\0';
  local_40._1_1_ = '\0';
  local_40._2_1_ = '\0';
  local_40._3_1_ = '\0';
  Variant::GetInto<float,_0>(&pPVar2->value,(float *)&local_40);
  _width = (int)(float)local_40._0_4_;
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  local_40 = (FontEffectOutline *)CONCAT44(local_40._4_4_,0xff000000);
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar2->value,(Colour<unsigned_char,_255,_false> *)&local_40);
  _colour = local_40._0_4_;
  local_40 = (FontEffectOutline *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::FontEffectOutline,std::allocator<Rml::FontEffectOutline>>
            (&local_38,&local_40,(allocator<Rml::FontEffectOutline> *)&local_41);
  bVar1 = FontEffectOutline::Initialise(local_40,_width);
  if (bVar1) {
    FontEffect::SetColour(&local_40->super_FontEffect,_colour);
    _Var3._M_pi = local_38._M_pi;
    (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_40;
    (this->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var3._M_pi;
    local_40 = (FontEffectOutline *)0x0;
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)0x0;
    (this->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectOutlineInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	float width = properties.GetProperty(id_width)->Get<float>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectOutline>();
	if (font_effect->Initialise(int(width)))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}